

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O1

void __thiscall
IndexCommand::IndexCommand
          (IndexCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,vector<IndexType,_std::allocator<IndexType>_> *types,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,bool ensure_unique)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->paths_,paths);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(&this->types_,types);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->taints_)._M_t,&taints->_M_t);
  this->ensure_unique_ = ensure_unique;
  return;
}

Assistant:

IndexCommand(const std::vector<std::string> &paths,
                 const std::vector<IndexType> &types,
                 std::set<std::string> taints, bool ensure_unique)
        : paths_(paths),
          types_(types),
          taints_(taints),
          ensure_unique_(ensure_unique) {}